

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprMightBeIndexed(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr,int op)

{
  int iTab;
  Index *pIVar1;
  u8 uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  Index **ppIVar6;
  long lVar7;
  
  uVar2 = pExpr->op;
  if (op - 0x36U < 4 && uVar2 == 0xa9) {
    pExpr = ((pExpr->x).pList)->a[0].pExpr;
    uVar2 = pExpr->op;
  }
  if (uVar2 != 0xa2) {
    if ((mPrereq ^ mPrereq - 1) <= mPrereq - 1) {
      return 0;
    }
    piVar5 = &pFrom->a[0].iCursor;
    for (; 1 < mPrereq; mPrereq = mPrereq >> 1) {
      piVar5 = piVar5 + 0x1c;
    }
    iTab = *piVar5;
    ppIVar6 = &(*(Table **)(piVar5 + -8))->pIndex;
    do {
      pIVar1 = *ppIVar6;
      if (pIVar1 == (Index *)0x0) {
        return 0;
      }
      if (pIVar1->aColExpr != (ExprList *)0x0) {
        lVar7 = 4;
        for (uVar4 = 0; uVar4 < pIVar1->nKeyCol; uVar4 = uVar4 + 1) {
          if ((pIVar1->aiColumn[uVar4] == -2) &&
             (iVar3 = sqlite3ExprCompareSkip
                                (pExpr,*(Expr **)((long)pIVar1->aColExpr->a + lVar7 * 2 + -8),iTab),
             iVar3 == 0)) {
            *aiCurCol = iTab;
            aiCurCol[1] = -2;
            return 1;
          }
          lVar7 = lVar7 + 0x10;
        }
      }
      ppIVar6 = &pIVar1->pNext;
    } while( true );
  }
  *aiCurCol = pExpr->iTable;
  aiCurCol[1] = (int)pExpr->iColumn;
  return 1;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  /* If this expression is a vector to the left or right of a 
  ** inequality constraint (>, <, >= or <=), perform the processing 
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }
  if( mPrereq==0 ) return 0;                 /* No table references */
  if( (mPrereq&(mPrereq-1))!=0 ) return 0;   /* Refs more than one table */
  return exprMightBeIndexed2(pFrom,mPrereq,aiCurCol,pExpr);
}